

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resample.c
# Opt level: O3

void dumb_reset_resampler_n
               (int n,DUMB_RESAMPLER *resampler,void *src,int src_channels,int32 pos,int32 start,
               int32 end,int quality)

{
  if (n == 0x10) {
    dumb_reset_resampler_16(resampler,(short *)src,src_channels,pos,start,end,quality);
  }
  else if (n == 8) {
    dumb_reset_resampler_8(resampler,(char *)src,src_channels,pos,start,end,quality);
  }
  else {
    dumb_reset_resampler(resampler,(sample_t_conflict *)src,src_channels,pos,start,end,quality);
  }
  return;
}

Assistant:

void dumb_reset_resampler_n(int n, DUMB_RESAMPLER *resampler, void *src, int src_channels, int32 pos, int32 start, int32 end, int quality)
{
	if (n == 8)
		dumb_reset_resampler_8(resampler, src, src_channels, pos, start, end, quality);
	else if (n == 16)
		dumb_reset_resampler_16(resampler, src, src_channels, pos, start, end, quality);
	else
		dumb_reset_resampler(resampler, src, src_channels, pos, start, end, quality);
}